

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaskPool.h
# Opt level: O2

bool __thiscall depspawn::internal::TaskPool::try_run(TaskPool *this)

{
  bool bVar1;
  Task *p;
  Task *local_10;
  
  bVar1 = boost::lockfree::
          queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
          pop<depspawn::internal::TaskPool::Task*>
                    ((queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>
                      *)&this->hp_queue_,&local_10);
  if ((!bVar1) &&
     (bVar1 = boost::lockfree::
              queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>::
              pop<depspawn::internal::TaskPool::Task*>
                        ((queue<depspawn::internal::TaskPool::Task*,boost::lockfree::fixed_sized<true>>
                          *)&this->queue_,&local_10), !bVar1)) {
    return false;
  }
  run(this,local_10);
  return true;
}

Assistant:

bool try_run()
  { Task *p;

    const bool ret = hp_queue_.pop(p) || queue_.pop(p);
    if (ret) {
      run(p);
    }

    return ret;
  }